

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O2

string * __thiscall
duckdb::Bit::ToBit_abi_cxx11_(string *__return_storage_ptr__,Bit *this,string_t str)

{
  bool bVar1;
  unique_ptr<char[],_std::default_delete<char[]>_> __src;
  ConversionException *this_00;
  string *output_str;
  string *in_R8;
  string_t str_00;
  string_t str_01;
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  string error_message;
  
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  error_message._M_string_length._0_4_ = 0;
  error_message._M_string_length._4_4_ = 0;
  error_message.field_2._M_local_buf[0] = '\0';
  output_str = &error_message;
  str_00.value.pointer.ptr = (char *)&buffer;
  str_00.value._0_8_ = str.value._0_8_;
  bVar1 = TryGetBitStringSize(this,str_00,(idx_t *)output_str,in_R8);
  if (bVar1) {
    ::std::__cxx11::string::~string((string *)&error_message);
    __src._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         operator_new__((ulong)buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
                               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl);
    error_message._M_dataplus._M_p._0_4_ =
         (uint)buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
    buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
    super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)
         __src._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if ((uint)error_message._M_dataplus._M_p < 0xd) {
      error_message._M_string_length._4_4_ = 0;
      error_message._M_dataplus._M_p._4_4_ = 0;
      error_message._M_string_length._0_4_ = 0;
      if ((uint)error_message._M_dataplus._M_p != 0) {
        switchD_00916250::default
                  ((void *)((long)&error_message._M_dataplus._M_p + 4),
                   (void *)__src._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                           .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl,
                   (ulong)((uint)error_message._M_dataplus._M_p & 0xf));
      }
    }
    else {
      error_message._M_string_length._0_4_ =
           __src._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl._0_4_;
      error_message._M_string_length._4_4_ =
           __src._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_;
    }
    str_01.value.pointer.ptr = (char *)&error_message;
    str_01.value._0_8_ = str.value._0_8_;
    ToBit(this,str_01,(bitstring_t *)output_str);
    string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&error_message);
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              (&buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>);
    return __return_storage_ptr__;
  }
  this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
  ConversionException::ConversionException(this_00,&error_message);
  __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string Bit::ToBit(string_t str) {
	auto bit_len = GetBitSize(str);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::ToBit(str, output_str);
	return output_str.GetString();
}